

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O0

void rsg::ValueRange::computeIntersection
               (ValueRangeAccess dst,ConstValueRangeAccess *a,ConstValueRangeAccess *b)

{
  ValueRangeAccess dst_00;
  ValueRangeAccess dst_01;
  bool bVar1;
  Type TVar2;
  int iVar3;
  VariableType *pVVar4;
  vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_> *this;
  size_type sVar5;
  float fVar6;
  byte local_412;
  byte local_411;
  ValueRangeAccess local_3f0;
  ConstStridedValueAccess<1> local_3d8;
  ValueRangeAccess local_3c8;
  ConstStridedValueAccess<1> local_3b0;
  ConstValueRangeAccess local_3a0;
  ConstValueAccess local_388;
  byte local_371;
  undefined1 local_370 [7];
  bool bMax_2;
  ConstValueAccess local_358;
  byte local_341;
  undefined1 local_340 [7];
  bool bMin_2;
  ConstValueAccess local_328;
  byte local_311;
  undefined1 local_310 [7];
  bool aMax_2;
  ConstValueAccess local_2f8;
  byte local_2e5;
  int local_2e4;
  undefined1 local_2e0 [3];
  bool aMin_2;
  int ndx_4;
  ConstStridedValueAccess<1> local_2c8;
  ValueRangeAccess local_2b8;
  ConstStridedValueAccess<1> local_2a0;
  ConstValueRangeAccess local_290;
  ConstValueAccess local_278;
  int local_264;
  undefined1 local_260 [4];
  int bMax_1;
  ConstValueAccess local_248;
  int local_234;
  undefined1 local_230 [4];
  int bMin_1;
  ConstValueAccess local_218;
  int local_204;
  undefined1 local_200 [4];
  int aMax_1;
  ConstValueAccess local_1e8;
  int local_1d8;
  int local_1d4;
  int aMin_1;
  int ndx_3;
  ConstStridedValueAccess<1> local_1b8;
  ValueRangeAccess local_1a8;
  ConstStridedValueAccess<1> local_190;
  ConstValueRangeAccess local_180;
  ConstValueAccess local_168;
  float local_154;
  undefined1 local_150 [4];
  float bMax;
  ConstValueAccess local_138;
  float local_124;
  undefined1 local_120 [4];
  float bMin;
  ConstValueAccess local_108;
  float local_f4;
  undefined1 local_f0 [4];
  float aMax;
  ConstValueAccess local_d8;
  float local_c4;
  int local_c0;
  float aMin;
  int ndx_2;
  int numElements_1;
  ConstValueRangeAccess local_a0;
  ValueRangeAccess local_88;
  int local_70;
  int local_6c;
  int ndx_1;
  int numElements;
  ConstValueRangeAccess local_50;
  ValueRangeAccess local_38;
  int local_20;
  int local_1c;
  int ndx;
  int numMembers;
  ConstValueRangeAccess *b_local;
  ConstValueRangeAccess *a_local;
  
  _ndx = b;
  b_local = a;
  pVVar4 = ConstValueRangeAccess::getType(a);
  bVar1 = VariableType::isStruct(pVVar4);
  if (bVar1) {
    pVVar4 = ConstValueRangeAccess::getType(b_local);
    this = VariableType::getMembers(pVVar4);
    sVar5 = std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::size
                      (this);
    local_1c = (int)sVar5;
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      ValueRangeAccess::member(&local_38,&dst,local_20);
      ConstValueRangeAccess::member(&local_50,b_local,local_20);
      ConstValueRangeAccess::member((ConstValueRangeAccess *)&ndx_1,_ndx,local_20);
      dst_00.super_ConstValueRangeAccess.m_min = local_38.super_ConstValueRangeAccess.m_min;
      dst_00.super_ConstValueRangeAccess.m_type = local_38.super_ConstValueRangeAccess.m_type;
      dst_00.super_ConstValueRangeAccess.m_max = local_38.super_ConstValueRangeAccess.m_max;
      computeIntersection(dst_00,&local_50,(ConstValueRangeAccess *)&ndx_1);
    }
  }
  else {
    pVVar4 = ConstValueRangeAccess::getType(b_local);
    bVar1 = VariableType::isArray(pVVar4);
    if (bVar1) {
      pVVar4 = ConstValueRangeAccess::getType(b_local);
      local_6c = VariableType::getNumElements(pVVar4);
      for (local_70 = 0; local_70 < local_6c; local_70 = local_70 + 1) {
        ValueRangeAccess::arrayElement(&local_88,&dst,local_70);
        ConstValueRangeAccess::arrayElement(&local_a0,b_local,local_70);
        ConstValueRangeAccess::arrayElement((ConstValueRangeAccess *)&ndx_2,_ndx,local_70);
        dst_01.super_ConstValueRangeAccess.m_min = local_88.super_ConstValueRangeAccess.m_min;
        dst_01.super_ConstValueRangeAccess.m_type = local_88.super_ConstValueRangeAccess.m_type;
        dst_01.super_ConstValueRangeAccess.m_max = local_88.super_ConstValueRangeAccess.m_max;
        computeIntersection(dst_01,&local_a0,(ConstValueRangeAccess *)&ndx_2);
      }
    }
    else {
      pVVar4 = ConstValueRangeAccess::getType(b_local);
      aMin = (float)VariableType::getNumElements(pVVar4);
      pVVar4 = ConstValueRangeAccess::getType(b_local);
      TVar2 = VariableType::getBaseType(pVVar4);
      switch(TVar2) {
      case TYPE_FLOAT:
        for (local_c0 = 0; local_c0 < (int)aMin; local_c0 = local_c0 + 1) {
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_f0,b_local,local_c0);
          local_d8 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_f0);
          local_c4 = ConstStridedValueAccess<1>::asFloat(&local_d8);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_120,b_local,local_c0);
          local_108 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)local_120);
          local_f4 = ConstStridedValueAccess<1>::asFloat(&local_108);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_150,_ndx,local_c0);
          local_138 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_150);
          local_124 = ConstStridedValueAccess<1>::asFloat(&local_138);
          ConstValueRangeAccess::component(&local_180,_ndx,local_c0);
          local_168 = ConstValueRangeAccess::getMax(&local_180);
          local_154 = ConstStridedValueAccess<1>::asFloat(&local_168);
          fVar6 = de::max<float>(local_c4,local_124);
          ValueRangeAccess::component(&local_1a8,&dst,local_c0);
          local_190 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin(&local_1a8);
          StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_190,fVar6);
          fVar6 = de::min<float>(local_f4,local_154);
          ValueRangeAccess::component((ValueRangeAccess *)&aMin_1,&dst,local_c0);
          local_1b8 = (ConstStridedValueAccess<1>)
                      ValueRangeAccess::getMax((ValueRangeAccess *)&aMin_1);
          StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_1b8,fVar6);
        }
        break;
      case TYPE_INT:
      case TYPE_SAMPLER_2D:
      case TYPE_SAMPLER_CUBE:
        for (local_1d4 = 0; local_1d4 < (int)aMin; local_1d4 = local_1d4 + 1) {
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_200,b_local,local_1d4);
          local_1e8 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_200);
          local_1d8 = ConstStridedValueAccess<1>::asInt(&local_1e8);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_230,b_local,local_1d4);
          local_218 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)local_230);
          local_204 = ConstStridedValueAccess<1>::asInt(&local_218);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_260,_ndx,local_1d4);
          local_248 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_260);
          local_234 = ConstStridedValueAccess<1>::asInt(&local_248);
          ConstValueRangeAccess::component(&local_290,_ndx,local_1d4);
          local_278 = ConstValueRangeAccess::getMax(&local_290);
          local_264 = ConstStridedValueAccess<1>::asInt(&local_278);
          iVar3 = de::max<int>(local_1d8,local_234);
          ValueRangeAccess::component(&local_2b8,&dst,local_1d4);
          local_2a0 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin(&local_2b8);
          StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_2a0,iVar3);
          iVar3 = de::min<int>(local_204,local_264);
          ValueRangeAccess::component((ValueRangeAccess *)local_2e0,&dst,local_1d4);
          local_2c8 = (ConstStridedValueAccess<1>)
                      ValueRangeAccess::getMax((ValueRangeAccess *)local_2e0);
          StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_2c8,iVar3);
        }
        break;
      case TYPE_BOOL:
        for (local_2e4 = 0; local_2e4 < (int)aMin; local_2e4 = local_2e4 + 1) {
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_310,b_local,local_2e4);
          local_2f8 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_310);
          local_2e5 = ConstStridedValueAccess<1>::asBool(&local_2f8);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_340,b_local,local_2e4);
          local_328 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)local_340);
          local_311 = ConstStridedValueAccess<1>::asBool(&local_328);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_370,_ndx,local_2e4);
          local_358 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_370);
          local_341 = ConstStridedValueAccess<1>::asBool(&local_358);
          ConstValueRangeAccess::component(&local_3a0,_ndx,local_2e4);
          local_388 = ConstValueRangeAccess::getMax(&local_3a0);
          local_371 = ConstStridedValueAccess<1>::asBool(&local_388);
          local_411 = 1;
          if ((local_2e5 & 1) == 0) {
            local_411 = local_341;
          }
          ValueRangeAccess::component(&local_3c8,&dst,local_2e4);
          local_3b0 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin(&local_3c8);
          StridedValueAccess<1>::operator=
                    ((StridedValueAccess<1> *)&local_3b0,(bool)(local_411 & 1));
          local_412 = 0;
          if ((local_311 & 1) != 0) {
            local_412 = local_371;
          }
          ValueRangeAccess::component(&local_3f0,&dst,local_2e4);
          local_3d8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax(&local_3f0);
          StridedValueAccess<1>::operator=
                    ((StridedValueAccess<1> *)&local_3d8,(bool)(local_412 & 1));
        }
        break;
      default:
      }
    }
  }
  return;
}

Assistant:

void ValueRange::computeIntersection (ValueRangeAccess dst, const ConstValueRangeAccess& a, const ConstValueRangeAccess& b)
{
	DE_ASSERT(dst.getType() == a.getType() && dst.getType() == b.getType());

	if (a.getType().isStruct())
	{
		int numMembers = (int)a.getType().getMembers().size();
		for (int ndx = 0; ndx < numMembers; ndx++)
			computeIntersection(dst.member(ndx), a.member(ndx), b.member(ndx));
	}
	else if (a.getType().isArray())
	{
		int numElements = (int)a.getType().getNumElements();
		for (int ndx = 0; ndx < numElements; ndx++)
			computeIntersection(dst.arrayElement(ndx), a.arrayElement(ndx), b.arrayElement(ndx));
	}
	else
	{
		int numElements = (int)a.getType().getNumElements();
		switch (a.getType().getBaseType())
		{
			case VariableType::TYPE_FLOAT:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					float aMin = a.component(ndx).getMin().asFloat();
					float aMax = a.component(ndx).getMax().asFloat();
					float bMin = b.component(ndx).getMin().asFloat();
					float bMax = b.component(ndx).getMax().asFloat();

					dst.component(ndx).getMin() = de::max(aMin, bMin);
					dst.component(ndx).getMax() = de::min(aMax, bMax);
				}
				break;

			case VariableType::TYPE_INT:
			case VariableType::TYPE_SAMPLER_2D:
			case VariableType::TYPE_SAMPLER_CUBE:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					int aMin = a.component(ndx).getMin().asInt();
					int aMax = a.component(ndx).getMax().asInt();
					int bMin = b.component(ndx).getMin().asInt();
					int bMax = b.component(ndx).getMax().asInt();

					dst.component(ndx).getMin() = de::max(aMin, bMin);
					dst.component(ndx).getMax() = de::min(aMax, bMax);
				}
				break;

			case VariableType::TYPE_BOOL:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					bool aMin = a.component(ndx).getMin().asBool();
					bool aMax = a.component(ndx).getMax().asBool();
					bool bMin = b.component(ndx).getMin().asBool();
					bool bMax = b.component(ndx).getMax().asBool();

					dst.component(ndx).getMin() = aMin || bMin;
					dst.component(ndx).getMax() = aMax && bMax;
				}
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}